

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

void __thiscall
glcts::ViewportArray::DrawTestBase::setupViewports
          (DrawTestBase *this,TEST_TYPE type,GLuint iteration_index)

{
  TestError *this_00;
  
  switch(type) {
  case VIEWPORT:
    if (iteration_index < 3) {
      setup4x4Viewport(this,iteration_index);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid value",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0xb57);
    break;
  case SCISSOR:
    if (iteration_index < 3) {
      setup4x4Scissor(this,iteration_index,false);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid value",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0xb67);
    break;
  case DEPTHRANGE:
    if (iteration_index < 2) {
      setup16x2Depths(this,iteration_index);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid value",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0xb76);
    break;
  case PROVOKING:
    if (iteration_index < 2) {
      setup2x2Viewport(this,iteration_index);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid value",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0xb85);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0xb8b);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void DrawTestBase::setupViewports(TEST_TYPE type, GLuint iteration_index)
{
	switch (type)
	{
	case VIEWPORT:
	{
		VIEWPORT_METHOD method;
		switch (iteration_index)
		{
		case 0:
		case 1:
		case 2:
			method = (VIEWPORT_METHOD)iteration_index;
			break;
		default:
			TCU_FAIL("Invalid value");
		}
		setup4x4Viewport(method);
	}
	break;
	case SCISSOR:
	{
		SCISSOR_METHOD method;
		switch (iteration_index)
		{
		case 0:
		case 1:
		case 2:
			method = (SCISSOR_METHOD)iteration_index;
			break;
		default:
			TCU_FAIL("Invalid value");
		}
		setup4x4Scissor(method, false /* set_zeros */);
	}
	break;
	case DEPTHRANGE:
	{
		DEPTH_RANGE_METHOD method;
		switch (iteration_index)
		{
		case 0:
		case 1:
			method = (DEPTH_RANGE_METHOD)iteration_index;
			break;
		default:
			TCU_FAIL("Invalid value");
		}
		setup16x2Depths(method);
	}
	break;
	case PROVOKING:
	{
		PROVOKING_VERTEX provoking;
		switch (iteration_index)
		{
		case 0:
		case 1:
			provoking = (PROVOKING_VERTEX)iteration_index;
			break;
		default:
			TCU_FAIL("Invalid value");
		}
		setup2x2Viewport(provoking);
	}
	break;
	default:
		TCU_FAIL("Invalid enum");
	}
}